

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

uint32 __thiscall
Clasp::Asp::LogicProgram::update(LogicProgram *this,PrgBody *body,uint32 oldHash,uint32 newHash)

{
  uint32 uVar1;
  
  removeBody(this,body,oldHash);
  uVar1 = 0x40000000;
  if (((body->super_PrgNode).field_0x7 & 0x40) == 0) {
    uVar1 = findEqBody(this,body,newHash);
    if (uVar1 == 0x40000000) {
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)this->index_);
      uVar1 = 0x40000000;
    }
  }
  return uVar1;
}

Assistant:

uint32 LogicProgram::update(PrgBody* body, uint32 oldHash, uint32 newHash) {
	uint32 id   = removeBody(body, oldHash);
	if (body->relevant()) {
		uint32 eqId = findEqBody(body, newHash);
		if (eqId == varMax) {
			// No equivalent body found.
			// Add new entry to index
			index_->body.insert(IndexMap::value_type(newHash, id));
		}
		return eqId;
	}
	return varMax;
}